

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-magic.c
# Opt level: O0

void borg_init_spell(borg_magic *spells,int spell_num)

{
  _Bool _Var1;
  int iVar2;
  borg_magic *pbVar3;
  class_spell_conflict *pcVar4;
  char *what;
  class_spell_conflict *cspell;
  borg_magic *spell;
  int spell_num_local;
  borg_magic *spells_local;
  
  pbVar3 = spells + spell_num;
  pcVar4 = spell_by_index(player,spell_num);
  iVar2 = strcmp(pcVar4->name,borg_spell_ratings[spell_num].name);
  if (iVar2 == 0) {
    pbVar3->rating = borg_spell_ratings[spell_num].rating;
    pbVar3->name = borg_spell_ratings[spell_num].name;
    pbVar3->spell_enum = borg_spell_ratings[spell_num].spell_enum;
    pbVar3->level = (uint8_t)pcVar4->slevel;
    iVar2 = borg_get_book_offset(pcVar4->sidx);
    pbVar3->book_offset = iVar2;
    pbVar3->effect_index = pcVar4->effect->index;
    pbVar3->power = (uint8_t)pcVar4->smana;
    pbVar3->sfail = (uint8_t)pcVar4->sfail;
    _Var1 = spell_okay_to_cast(player,spell_num);
    pbVar3->status = _Var1;
    pbVar3->times = 0;
    pbVar3->book = pcVar4->bidx;
  }
  else {
    what = format("**STARTUP FAILURE** spell definition mismatch. <%s> not the same as <%s>",
                  pcVar4->name,borg_spell_ratings[spell_num].name);
    borg_note(what);
    borg_init_failure = true;
  }
  return;
}

Assistant:

static void borg_init_spell(borg_magic *spells, int spell_num)
{
    borg_magic               *spell  = &spells[spell_num];
    const struct class_spell *cspell = spell_by_index(player, spell_num);
    if (strcmp(cspell->name, borg_spell_ratings[spell_num].name)) {
        borg_note(format("**STARTUP FAILURE** spell definition mismatch. "
                         "<%s> not the same as <%s>",
            cspell->name, borg_spell_ratings[spell_num].name));
        borg_init_failure = true;
        return;
    }
    spell->rating       = borg_spell_ratings[spell_num].rating;
    spell->name         = borg_spell_ratings[spell_num].name;
    spell->spell_enum   = borg_spell_ratings[spell_num].spell_enum;
    spell->level        = cspell->slevel;
    spell->book_offset  = borg_get_book_offset(cspell->sidx);
    spell->effect_index = cspell->effect->index;
    spell->power        = cspell->smana;
    spell->sfail        = cspell->sfail;
    spell->status       = spell_okay_to_cast(player, spell_num);
    spell->times        = 0;
    spell->book         = cspell->bidx;
}